

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::validateResultImage
               (TestTexture *texture,VkImageViewType imageViewType,
               VkImageSubresourceRange *subresource,Sampler *sampler,
               VkComponentMapping *componentMapping,ConstPixelBufferAccess *coordAccess,
               Vec2 *lodBounds,LookupPrecision *lookupPrecision,Vec4 *lookupScale,Vec4 *lookupBias,
               ConstPixelBufferAccess *resultAccess,PixelBufferAccess *errorAccess)

{
  PtrData<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> data;
  PtrData<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> data_00;
  PtrData<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> data_01;
  PtrData<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> data_02;
  PtrData<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> data_03;
  PtrData<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_> data_04;
  PtrData<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> data_05;
  Texture1DView *texture_00;
  Texture1DArrayView *texture_01;
  Texture2DView *texture_02;
  Texture2DArrayView *texture_03;
  TextureCubeView *texture_04;
  TextureCubeArrayView *texture_05;
  Texture3DView *texture_06;
  TextureCubeView *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  PtrData<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> local_1c8;
  PtrData<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *local_1b8;
  undefined1 local_1a8 [8];
  UniquePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> texView_6;
  undefined1 local_178 [8];
  UniquePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_> texView_5;
  undefined1 local_148 [8];
  UniquePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> texView_4;
  undefined1 local_118 [8];
  UniquePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> texView_3;
  undefined1 local_e8 [8];
  UniquePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> texView_2;
  undefined1 local_b8 [8];
  UniquePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> texView_1;
  PtrData<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> local_98;
  PtrData<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *local_88;
  undefined1 local_78 [8];
  UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> texView;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> levels;
  ConstPixelBufferAccess *coordAccess_local;
  VkComponentMapping *componentMapping_local;
  Sampler *sampler_local;
  VkImageSubresourceRange *subresource_local;
  VkImageViewType imageViewType_local;
  TestTexture *texture_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
              m_data.field_0x8);
  switch(imageViewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
    getTexture1DView((MovePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *)
                     &local_98,texture,subresource,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&texView.
                         super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>
                         .m_data.field_0x8);
    local_88 = de::details::MovePtr::operator_cast_to_PtrData(&local_98,(MovePtr *)texture);
    data._8_8_ = in_stack_fffffffffffffda0;
    data.ptr = (Texture1DView *)in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::UniquePtr
              ((UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *)local_78,
               data);
    de::details::MovePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::~MovePtr
              ((MovePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *)&local_98);
    texture_00 = de::details::
                 UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::operator*
                           ((UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>
                             *)local_78);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture1DView>
                   (texture_00,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>::~UniquePtr
              ((UniquePtr<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_> *)local_78);
    break;
  case VK_IMAGE_VIEW_TYPE_2D:
    getTexture2DView((MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)
                     &texView_3.
                      super_UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>
                      .m_data.field_0x8,texture,subresource,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&texView.
                         super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>
                         .m_data.field_0x8);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)
               &texView_3.
                super_UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>
                .m_data.field_0x8,(MovePtr *)texture);
    data_01._8_8_ = in_stack_fffffffffffffda0;
    data_01.ptr = (Texture2DView *)in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::UniquePtr
              ((UniquePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)local_e8,
               data_01);
    de::details::MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::~MovePtr
              ((MovePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)
               &texView_3.
                super_UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>
                .m_data.field_0x8);
    texture_02 = de::details::
                 UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::operator*
                           ((UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>
                             *)local_e8);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture2DView>
                   (texture_02,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>::~UniquePtr
              ((UniquePtr<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_> *)local_e8);
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    getTexture3DView((MovePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)
                     &local_1c8,texture,subresource,
                     (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      *)&texView.
                         super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>
                         .m_data.field_0x8);
    local_1b8 = de::details::MovePtr::operator_cast_to_PtrData(&local_1c8,(MovePtr *)texture);
    data_05._8_8_ = in_stack_fffffffffffffda0;
    data_05.ptr = (Texture3DView *)in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::UniquePtr
              ((UniquePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)local_1a8,
               data_05);
    de::details::MovePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::~MovePtr
              ((MovePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)&local_1c8);
    texture_06 = de::details::
                 UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::operator*
                           ((UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>
                             *)local_1a8);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture3DView>
                   (texture_06,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>::~UniquePtr
              ((UniquePtr<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_> *)local_1a8);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    getTextureCubeView((MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
                       &texView_5.
                        super_UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                        .m_data.field_0x8,texture,subresource,
                       (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        *)&texView.
                           super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>
                           .m_data.field_0x8);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
               &texView_5.
                super_UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                .m_data.field_0x8,(MovePtr *)texture);
    data_03._8_8_ = in_stack_fffffffffffffda0;
    data_03.ptr = in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::
    UniquePtr((UniquePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
              local_148,data_03);
    de::details::MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::~MovePtr
              ((MovePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
               &texView_5.
                super_UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                .m_data.field_0x8);
    texture_04 = de::details::
                 UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::
                 operator*((UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>
                            *)local_148);
    texture_local._7_1_ =
         validateResultImage<tcu::TextureCubeView>
                   (texture_04,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>::
    ~UniquePtr((UniquePtr<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_> *)
               local_148);
    break;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    getTexture1DArrayView
              ((MovePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *)
               &texView_2.
                super_UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>.m_data
                .field_0x8,texture,subresource,
               (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               &texView.
                super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data
                .field_0x8);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *)
               &texView_2.
                super_UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>.m_data
                .field_0x8,(MovePtr *)texture);
    data_00._8_8_ = in_stack_fffffffffffffda0;
    data_00.ptr = (Texture1DArrayView *)in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
    UniquePtr((UniquePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *)
              local_b8,data_00);
    de::details::MovePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
    ~MovePtr((MovePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *)
             &texView_2.
              super_UniqueBase<tcu::Texture2DView,_de::DefaultDeleter<tcu::Texture2DView>_>.m_data.
              field_0x8);
    texture_01 = de::details::
                 UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
                 operator*((UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>
                            *)local_b8);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture1DArrayView>
                   (texture_01,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>::
    ~UniquePtr((UniquePtr<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_> *)
               local_b8);
    break;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    getTexture2DArrayView
              ((MovePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *)
               &texView_4.
                super_UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>.
                m_data.field_0x8,texture,subresource,
               (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               &texView.
                super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data
                .field_0x8);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *)
               &texView_4.
                super_UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>.
                m_data.field_0x8,(MovePtr *)texture);
    data_02._8_8_ = in_stack_fffffffffffffda0;
    data_02.ptr = (Texture2DArrayView *)in_stack_fffffffffffffd98;
    de::details::UniquePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
    UniquePtr((UniquePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *)
              local_118,data_02);
    de::details::MovePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
    ~MovePtr((MovePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *)
             &texView_4.
              super_UniqueBase<tcu::TextureCubeView,_de::DefaultDeleter<tcu::TextureCubeView>_>.
              m_data.field_0x8);
    texture_03 = de::details::
                 UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
                 operator*((UniqueBase<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>
                            *)local_118);
    texture_local._7_1_ =
         validateResultImage<tcu::Texture2DArrayView>
                   (texture_03,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::UniquePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_>::
    ~UniquePtr((UniquePtr<tcu::Texture2DArrayView,_de::DefaultDeleter<tcu::Texture2DArrayView>_> *)
               local_118);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    getTextureCubeArrayView
              ((MovePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_> *
               )&texView_6.
                 super_UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>.
                 m_data.field_0x8,texture,subresource,
               (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
               &texView.
                super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.m_data
                .field_0x8);
    de::details::MovePtr::operator_cast_to_PtrData
              ((PtrData<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_> *
               )&texView_6.
                 super_UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>.
                 m_data.field_0x8,(MovePtr *)texture);
    data_04._8_8_ = in_stack_fffffffffffffda0;
    data_04.ptr = (TextureCubeArrayView *)in_stack_fffffffffffffd98;
    de::details::
    UniquePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>::UniquePtr
              ((UniquePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                *)local_178,data_04);
    de::details::MovePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
    ::~MovePtr((MovePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_> *
               )&texView_6.
                 super_UniqueBase<tcu::Texture3DView,_de::DefaultDeleter<tcu::Texture3DView>_>.
                 m_data.field_0x8);
    texture_05 = de::details::
                 UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                 ::operator*((UniqueBase<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                              *)local_178);
    texture_local._7_1_ =
         validateResultImage<tcu::TextureCubeArrayView>
                   (texture_05,sampler,componentMapping,coordAccess,lodBounds,lookupPrecision,
                    lookupScale,lookupBias,resultAccess,errorAccess);
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
    de::details::
    UniquePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>::~UniquePtr
              ((UniquePtr<tcu::TextureCubeArrayView,_de::DefaultDeleter<tcu::TextureCubeArrayView>_>
                *)local_178);
    break;
  default:
    texture_local._7_1_ = false;
    texView_1.
    super_UniqueBase<tcu::Texture1DArrayView,_de::DefaultDeleter<tcu::Texture1DArrayView>_>.m_data.
    _8_4_ = 1;
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &texView.super_UniqueBase<tcu::Texture1DView,_de::DefaultDeleter<tcu::Texture1DView>_>.
              m_data.field_0x8);
  return texture_local._7_1_;
}

Assistant:

bool validateResultImage (const TestTexture&					texture,
						  const VkImageViewType					imageViewType,
						  const VkImageSubresourceRange&		subresource,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			componentMapping,
						  const tcu::ConstPixelBufferAccess&	coordAccess,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	resultAccess,
						  const tcu::PixelBufferAccess&			errorAccess)
{
	std::vector<tcu::ConstPixelBufferAccess>	levels;

	switch (imageViewType)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
		{
			UniquePtr<tcu::Texture1DView>			texView(getTexture1DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		{
			UniquePtr<tcu::Texture1DArrayView>		texView(getTexture1DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D:
		{
			UniquePtr<tcu::Texture2DView>			texView(getTexture2DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		{
			UniquePtr<tcu::Texture2DArrayView>		texView(getTexture2DArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE:
		{
			UniquePtr<tcu::TextureCubeView>			texView(getTextureCubeView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			UniquePtr<tcu::TextureCubeArrayView>	texView(getTextureCubeArrayView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
			break;
		}

		case VK_IMAGE_VIEW_TYPE_3D:
		{
			UniquePtr<tcu::Texture3DView>			texView(getTexture3DView(texture, subresource, levels));

			return validateResultImage(*texView, sampler, componentMapping, coordAccess, lodBounds, lookupPrecision, lookupScale, lookupBias, resultAccess, errorAccess);
		}

		default:
			DE_ASSERT(false);
			return false;
	}
}